

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O3

void VCProjectWriter::outputFileConfig(VCFilter *filter,XmlOutput *xml,QString *filename)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  VCConfiguration *pVVar4;
  VCProjectWriter *pVVar5;
  QString *pQVar6;
  char16_t *pcVar7;
  QString str;
  QArrayData *pQVar8;
  undefined8 uVar9;
  bool bVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  XmlOutput *pXVar13;
  QArrayData *pQVar14;
  long in_FS_OFFSET;
  QAnyStringView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  bool inBuild;
  undefined8 in_stack_fffffffffffffbc8;
  QArrayData *pQVar21;
  xml_output local_410;
  xml_output local_3d8;
  QArrayData *local_3a0;
  char16_t *local_398;
  undefined1 *puStack_390;
  undefined1 *local_388;
  QArrayData *pQStack_380;
  char16_t *local_378;
  undefined1 *puStack_370;
  bool local_359;
  undefined1 local_358 [112];
  char16_t *pcStack_2e8;
  Data *local_2e0;
  QArrayData *local_2d8;
  char16_t *pcStack_2d0;
  qsizetype local_2c8;
  VCConfiguration *local_2c0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  filter->useCustomBuildTool = false;
  filter->useCompilerTool = false;
  local_358._0_8_ = &PTR__VCCustomBuildTool_002e2a08;
  memset((QArrayDataPointer<QString> *)(local_358 + 8),0,0x90);
  QVar15.m_size = (size_t)"VCCustomBuildTool";
  QVar15.field_0.m_data_utf8 = local_358 + 0x68;
  QString::assign(QVar15);
  uVar12 = local_358._24_8_;
  uVar11 = local_358._16_8_;
  uVar9 = local_358._8_8_;
  local_358._24_8_ = (QArrayData *)0x0;
  local_358._8_8_ = (QArrayData *)0x0;
  local_358._16_8_ = (QArrayData *)0x0;
  local_3d8._0_8_ = (filter->CustomBuildTool).AdditionalDependencies.d.d;
  local_3d8.xo_text.d.d = (Data *)(filter->CustomBuildTool).AdditionalDependencies.d.ptr;
  (filter->CustomBuildTool).AdditionalDependencies.d.d = (Data *)uVar9;
  (filter->CustomBuildTool).AdditionalDependencies.d.ptr = (QString *)uVar11;
  local_3d8.xo_text.d.ptr = (char16_t *)(filter->CustomBuildTool).AdditionalDependencies.d.size;
  (filter->CustomBuildTool).AdditionalDependencies.d.size = uVar12;
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_3d8);
  uVar12 = local_358._48_8_;
  uVar11 = local_358._40_8_;
  uVar9 = local_358._32_8_;
  local_358._48_8_ = 0;
  local_358._32_8_ = (QArrayData *)0x0;
  local_358._40_8_ = (QString *)0x0;
  local_3d8._0_8_ = (filter->CustomBuildTool).CommandLine.d.d;
  local_3d8.xo_text.d.d = (Data *)(filter->CustomBuildTool).CommandLine.d.ptr;
  (filter->CustomBuildTool).CommandLine.d.d = (Data *)uVar9;
  (filter->CustomBuildTool).CommandLine.d.ptr = (QString *)uVar11;
  local_3d8.xo_text.d.ptr = (char16_t *)(filter->CustomBuildTool).CommandLine.d.size;
  (filter->CustomBuildTool).CommandLine.d.size = uVar12;
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_3d8);
  uVar12 = local_358._96_8_;
  uVar11 = local_358._88_8_;
  uVar9 = local_358._80_8_;
  pQVar21 = &((filter->CustomBuildTool).Description.d.d)->super_QArrayData;
  pQVar6 = (QString *)(filter->CustomBuildTool).Description.d.ptr;
  (filter->CustomBuildTool).Description.d.d = (Data *)local_358._56_8_;
  (filter->CustomBuildTool).Description.d.ptr = (char16_t *)local_358._64_8_;
  qVar1 = (filter->CustomBuildTool).Description.d.size;
  (filter->CustomBuildTool).Description.d.size = local_358._72_8_;
  local_358._96_8_ = 0;
  local_358._80_8_ = (Data *)0x0;
  local_358._88_8_ = (char16_t *)0x0;
  local_3d8._0_8_ = (filter->CustomBuildTool).Outputs.d.d;
  local_3d8.xo_text.d.d = (Data *)(filter->CustomBuildTool).Outputs.d.ptr;
  (filter->CustomBuildTool).Outputs.d.d = (Data *)uVar9;
  (filter->CustomBuildTool).Outputs.d.ptr = (QString *)uVar11;
  local_3d8.xo_text.d.ptr = (char16_t *)(filter->CustomBuildTool).Outputs.d.size;
  (filter->CustomBuildTool).Outputs.d.size = uVar12;
  local_358._56_8_ = pQVar21;
  local_358._64_8_ = pQVar6;
  local_358._72_8_ = qVar1;
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_3d8);
  pQVar14 = &((filter->CustomBuildTool).ToolName.d.d)->super_QArrayData;
  pcVar7 = (filter->CustomBuildTool).ToolName.d.ptr;
  (filter->CustomBuildTool).ToolName.d.d = (Data *)local_358._104_8_;
  (filter->CustomBuildTool).ToolName.d.ptr = pcStack_2e8;
  pDVar2 = (Data *)(filter->CustomBuildTool).ToolName.d.size;
  (filter->CustomBuildTool).ToolName.d.size = (qsizetype)local_2e0;
  pQVar21 = &((filter->CustomBuildTool).ToolPath.d.d)->super_QArrayData;
  pcVar3 = (filter->CustomBuildTool).ToolPath.d.ptr;
  (filter->CustomBuildTool).ToolPath.d.d = (Data *)local_2d8;
  (filter->CustomBuildTool).ToolPath.d.ptr = pcStack_2d0;
  qVar1 = (filter->CustomBuildTool).ToolPath.d.size;
  (filter->CustomBuildTool).ToolPath.d.size = local_2c8;
  (filter->CustomBuildTool).config = local_2c0;
  local_358._0_8_ = &PTR__VCCustomBuildTool_002e2a08;
  local_358._104_8_ = pQVar14;
  pcStack_2e8 = pcVar7;
  local_2e0 = pDVar2;
  local_2d8 = pQVar21;
  pcStack_2d0 = pcVar3;
  local_2c8 = qVar1;
  if (pQVar21 != (QArrayData *)0x0) {
    LOCK();
    (pQVar21->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar21->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar21->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar21,2,0x10);
    }
  }
  if ((QArrayData *)local_358._104_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_358._104_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_358._104_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_358._104_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_358._104_8_,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)(local_358 + 0x50));
  if ((QArrayData *)local_358._56_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_358._56_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_358._56_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_358._56_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_358._56_8_,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)(local_358 + 0x20));
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)(local_358 + 8));
  VCCLCompilerTool::VCCLCompilerTool((VCCLCompilerTool *)local_358);
  VCCLCompilerTool::operator=(&filter->CompilerTool,(VCCLCompilerTool *)local_358);
  VCCLCompilerTool::~VCCLCompilerTool((VCCLCompilerTool *)local_358);
  (filter->CustomBuildTool).config = filter->Config;
  (filter->CompilerTool).BufferSecurityCheck = unset;
  (filter->CompilerTool).DebugInformationFormat = debugUnknown;
  (filter->CompilerTool).ExceptionHandling = ehDefault;
  (filter->CompilerTool).GeneratePreprocessedFile = preprocessUnknown;
  (filter->CompilerTool).Optimization = optimizeDefault;
  if ((filter->CompilerTool).ProgramDataBaseFileName.d.ptr != (char16_t *)0x0) {
    pQVar21 = &((filter->CompilerTool).ProgramDataBaseFileName.d.d)->super_QArrayData;
    (filter->CompilerTool).ProgramDataBaseFileName.d.d = (Data *)0x0;
    (filter->CompilerTool).ProgramDataBaseFileName.d.ptr = (char16_t *)0x0;
    (filter->CompilerTool).ProgramDataBaseFileName.d.size = 0;
    if (pQVar21 != (QArrayData *)0x0) {
      LOCK();
      (pQVar21->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar21->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar21->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar21,2,0x10);
      }
    }
  }
  (filter->CompilerTool).RuntimeLibrary = rtUnknown;
  (filter->CompilerTool).WarningLevel = warningLevelUnknown;
  (filter->CompilerTool).config = filter->Config;
  local_359 = true;
  local_378 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_370 = &DAT_aaaaaaaaaaaaaaaa;
  local_388 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_380 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  VCFilter::findFile((VCFilterFile *)&local_388,filter,filename,&local_359);
  local_359 = (bool)(local_359 & (local_388._0_1_ ^ 1U));
  if (local_359 == false) {
    if (local_388._0_1_ != false) {
      filter->useCompilerTool = true;
    }
  }
  else {
    VCFilter::addExtraCompiler(filter,(VCFilterFile *)&local_388);
    if (filter->Project->usePCH == true) {
      local_3a0 = pQStack_380;
      local_398 = local_378;
      puStack_390 = puStack_370;
      if (pQStack_380 != (QArrayData *)0x0) {
        LOCK();
        (pQStack_380->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQStack_380->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      str.d.ptr = (char16_t *)xml;
      str.d.d = (Data *)in_stack_fffffffffffffbc8;
      str.d.size = (qsizetype)filename;
      VCFilter::modifyPCHstage(filter,str);
      if (local_3a0 != (QArrayData *)0x0) {
        LOCK();
        (local_3a0->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_3a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_3a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_3a0,2,0x10);
        }
      }
    }
  }
  if (((filter->useCustomBuildTool != false) || (filter->useCompilerTool != false)) ||
     (local_359 == false)) {
    QVar16.m_data = (storage_type *)0x11;
    QVar16.m_size = (qsizetype)local_358;
    QString::fromUtf8(QVar16);
    local_358._24_8_ = local_358._16_8_;
    local_358._16_8_ = local_358._8_8_;
    pQVar21 = (QArrayData *)local_358._0_8_;
    local_358._0_4_ = 3;
    local_358._8_8_ = pQVar21;
    if (pQVar21 != (QArrayData *)0x0) {
      LOCK();
      *(int *)pQVar21 = *(int *)pQVar21 + 1;
      UNLOCK();
    }
    local_358._32_8_ = (QArrayData *)0x0;
    local_358._40_8_ = (QString *)0x0;
    local_358._48_8_ = 0;
    pXVar13 = XmlOutput::operator<<(xml,(xml_output *)local_358);
    pQVar14 = (QArrayData *)&local_3d8;
    QVar17.m_data = (storage_type *)0x4;
    QVar17.m_size = (qsizetype)pQVar14;
    QString::fromUtf8(QVar17);
    local_3d8.xo_text.d.size = (qsizetype)local_3d8.xo_text.d.ptr;
    local_3d8.xo_text.d.ptr = (char16_t *)local_3d8.xo_text.d.d;
    uVar9 = local_3d8._0_8_;
    pVVar4 = filter->Config;
    local_3d8.xo_type = 7;
    local_3d8.xo_text.d.d = (Data *)uVar9;
    if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_3d8.xo_value.d.d = (pVVar4->Name).d.d;
    local_3d8.xo_value.d.ptr = (pVVar4->Name).d.ptr;
    local_3d8.xo_value.d.size = (pVVar4->Name).d.size;
    if (&(local_3d8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_3d8.xo_value.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_3d8.xo_value.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pXVar13 = XmlOutput::operator<<(pXVar13,&local_3d8);
    bVar10 = local_359;
    if (local_359 == false) {
      QVar18.m_data = (storage_type *)0x4;
      QVar18.m_size = (qsizetype)&local_410;
      QString::fromUtf8(QVar18);
      local_410.xo_value.d.size = (qsizetype)local_410.xo_text.d.ptr;
      local_410.xo_value.d.ptr = (char16_t *)local_410.xo_text.d.d;
      pQVar14 = (QArrayData *)CONCAT44(local_410._4_4_,local_410.xo_type);
      if ((QArrayData *)local_410.xo_text.d.ptr == (QArrayData *)0x0) {
        local_410.xo_type = tNothing;
        local_410.xo_text.d.d = (Data *)0x0;
        local_410.xo_text.d.ptr = (char16_t *)0x0;
        local_410.xo_text.d.size = 0;
        local_410.xo_value.d.d = (Data *)0x0;
        local_410.xo_value.d.ptr = (char16_t *)0x0;
        local_410.xo_value.d.size = 0;
      }
      else {
        QVar19.m_data = (storage_type *)0x11;
        QVar19.m_size = (qsizetype)&local_410;
        QString::fromUtf8(QVar19);
        local_410.xo_text.d.size = (qsizetype)local_410.xo_text.d.ptr;
        pQVar8 = (QArrayData *)CONCAT44(local_410._4_4_,local_410.xo_type);
        local_410.xo_type = tAttribute;
        local_410.xo_text.d.ptr = (char16_t *)local_410.xo_text.d.d;
        if (pQVar8 != (QArrayData *)0x0) {
          LOCK();
          (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        if (pQVar14 != (QArrayData *)0x0) {
          LOCK();
          (pQVar14->ref_)._q_value = (Type)((int)(pQVar14->ref_)._q_value + 1);
          UNLOCK();
        }
        local_410.xo_text.d.d = (Data *)pQVar8;
        local_410.xo_value.d.d = (Data *)pQVar14;
        if (pQVar8 != (QArrayData *)0x0) {
          LOCK();
          (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar8,2,0x10);
          }
        }
      }
    }
    else {
      local_410.xo_type = tNothing;
      local_410.xo_text.d.d = (Data *)0x0;
      local_410.xo_text.d.ptr = (char16_t *)0x0;
      local_410.xo_text.d.size = 0;
      local_410.xo_value.d.d = (Data *)0x0;
      local_410.xo_value.d.ptr = (char16_t *)0x0;
      local_410.xo_value.d.size = 0;
    }
    XmlOutput::operator<<(pXVar13,&local_410);
    if (&(local_410.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_410.xo_value.d.d)->super_QArrayData).ref_._q_value =
           (Type)((int)((local_410.xo_value.d.d)->super_QArrayData).ref_._q_value + -1);
      UNLOCK();
      if ((__atomic_base<int>)
          *(__int_type *)&((local_410.xo_value.d.d)->super_QArrayData).ref_._q_value ==
          (__atomic_base<int>)0x0) {
        QArrayData::deallocate(&(local_410.xo_value.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_410.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_410.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_410.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_410.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_410.xo_text.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (bVar10 == false && pQVar14 != (QArrayData *)0x0) {
      LOCK();
      (pQVar14->ref_)._q_value = (Type)((int)(pQVar14->ref_)._q_value + -1);
      UNLOCK();
      if ((__atomic_base<int>)*(__int_type *)&(pQVar14->ref_)._q_value == (__atomic_base<int>)0x0) {
        QArrayData::deallocate(pQVar14,2,0x10);
      }
    }
    if (&(local_3d8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_3d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_3d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_3d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_3d8.xo_value.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_3d8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_3d8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_3d8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_3d8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_3d8.xo_text.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
      }
    }
    if ((QArrayData *)local_358._32_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_358._32_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_358._32_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_358._32_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_358._32_8_,2,0x10);
      }
    }
    if ((QArrayData *)local_358._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_358._8_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_358._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_358._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_358._8_8_,2,0x10);
      }
    }
    if (pQVar21 != (QArrayData *)0x0) {
      LOCK();
      (pQVar21->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar21->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar21->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar21,2,0x10);
      }
    }
    if (filter->useCustomBuildTool == true) {
      pVVar5 = filter->Project->projectWriter;
      (*pVVar5->_vptr_VCProjectWriter[8])(pVVar5,xml,&filter->CustomBuildTool);
    }
    if (filter->useCompilerTool == true) {
      pVVar5 = filter->Project->projectWriter;
      (*pVVar5->_vptr_VCProjectWriter[4])(pVVar5,xml,&filter->CompilerTool);
    }
    QVar20.m_data = (storage_type *)0x11;
    QVar20.m_size = (qsizetype)local_358;
    QString::fromUtf8(QVar20);
    local_358._24_8_ = local_358._16_8_;
    local_358._16_8_ = local_358._8_8_;
    uVar9 = local_358._0_8_;
    local_358._0_4_ = 6;
    local_358._8_8_ = uVar9;
    if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
      LOCK();
      *(int *)uVar9 = *(int *)uVar9 + 1;
      UNLOCK();
    }
    local_358._32_8_ = (QArrayData *)0x0;
    local_358._40_8_ = (QString *)0x0;
    local_358._48_8_ = 0;
    XmlOutput::operator<<(xml,(xml_output *)local_358);
    if ((QArrayData *)local_358._32_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_358._32_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_358._32_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_358._32_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_358._32_8_,2,0x10);
      }
    }
    if ((QArrayData *)local_358._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_358._8_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_358._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_358._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_358._8_8_,2,0x10);
      }
    }
    if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
      LOCK();
      *(int *)uVar9 = *(int *)uVar9 + -1;
      UNLOCK();
      if (*(int *)uVar9 == 0) {
        QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
      }
    }
  }
  if (pQStack_380 != (QArrayData *)0x0) {
    LOCK();
    (pQStack_380->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQStack_380->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQStack_380->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQStack_380,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void VCProjectWriter::outputFileConfig(VCFilter &filter, XmlOutput &xml, const QString &filename)
{
    // Clearing each filter tool
    filter.useCustomBuildTool = false;
    filter.useCompilerTool = false;
    filter.CustomBuildTool = VCCustomBuildTool();
    filter.CompilerTool = VCCLCompilerTool();

    // Unset some default options
    filter.CustomBuildTool.config = filter.Config;
    filter.CompilerTool.BufferSecurityCheck = unset;
    filter.CompilerTool.DebugInformationFormat = debugUnknown;
    filter.CompilerTool.ExceptionHandling = ehDefault;
    filter.CompilerTool.GeneratePreprocessedFile = preprocessUnknown;
    filter.CompilerTool.Optimization = optimizeDefault;
    filter.CompilerTool.ProgramDataBaseFileName.clear();
    filter.CompilerTool.RuntimeLibrary = rtUnknown;
    filter.CompilerTool.WarningLevel = warningLevelUnknown;
    filter.CompilerTool.config = filter.Config;

    bool inBuild;
    VCFilterFile info = filter.findFile(filename, &inBuild);
    inBuild &= !info.excludeFromBuild;

    if (inBuild) {
        filter.addExtraCompiler(info);
        if(filter.Project->usePCH)
            filter.modifyPCHstage(info.file);
    } else {
        // Excluded files uses an empty compiler stage
        if(info.excludeFromBuild)
            filter.useCompilerTool = true;
    }

    // Actual XML output ----------------------------------
    if (filter.useCustomBuildTool || filter.useCompilerTool || !inBuild) {
        xml << tag(_FileConfiguration)
                << attr(_Name, filter.Config->Name)
                << (!inBuild ? attrS(_ExcludedFromBuild, "true") : noxml());
        if (filter.useCustomBuildTool)
            filter.Project->projectWriter->write(xml, filter.CustomBuildTool);
        if (filter.useCompilerTool)
            filter.Project->projectWriter->write(xml, filter.CompilerTool);
        xml << closetag(_FileConfiguration);
    }
}